

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ItemSimilarityRecommender::ByteSizeLong(ItemSimilarityRecommender *this)

{
  bool bVar1;
  int iVar2;
  reference value;
  ulong uVar3;
  string *psVar4;
  size_t sVar5;
  long lVar6;
  int cached_size;
  ItemSimilarityRecommender_SimilarItems *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  ItemSimilarityRecommender *this_local;
  
  iVar2 = _internal_itemitemsimilarities_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = google::protobuf::
           RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::begin
                     (&this->itemitemsimilarities_);
  msg = (ItemSimilarityRecommender_SimilarItems *)
        google::protobuf::
        RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::end
                  (&this->itemitemsimilarities_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
                 ::operator!=(&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
            ::operator*(&__end2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>(value);
    sStack_18 = sVar5 + sStack_18;
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::
    operator++(&__end2);
  }
  _internal_iteminputfeaturename_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = _internal_iteminputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  _internal_numrecommendationsinputfeaturename_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = _internal_numrecommendationsinputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  _internal_itemrestrictioninputfeaturename_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = _internal_itemrestrictioninputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  _internal_itemexclusioninputfeaturename_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = _internal_itemexclusioninputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  _internal_recommendeditemlistoutputfeaturename_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = _internal_recommendeditemlistoutputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sStack_18 = sVar5 + 2 + sStack_18;
  }
  _internal_recommendeditemscoreoutputfeaturename_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = _internal_recommendeditemscoreoutputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sStack_18 = sVar5 + 2 + sStack_18;
  }
  bVar1 = _internal_has_itemstringids(this);
  if (bVar1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::StringVector>(this->itemstringids_);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  bVar1 = _internal_has_itemint64ids(this);
  if (bVar1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::Int64Vector>(this->itemint64ids_);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar6 = std::__cxx11::string::size();
    sStack_18 = lVar6 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t ItemSimilarityRecommender::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ItemSimilarityRecommender)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
  total_size += 1UL * this->_internal_itemitemsimilarities_size();
  for (const auto& msg : this->itemitemsimilarities_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string itemInputFeatureName = 10;
  if (!this->_internal_iteminputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_iteminputfeaturename());
  }

  // string numRecommendationsInputFeatureName = 11;
  if (!this->_internal_numrecommendationsinputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_numrecommendationsinputfeaturename());
  }

  // string itemRestrictionInputFeatureName = 12;
  if (!this->_internal_itemrestrictioninputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_itemrestrictioninputfeaturename());
  }

  // string itemExclusionInputFeatureName = 13;
  if (!this->_internal_itemexclusioninputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_itemexclusioninputfeaturename());
  }

  // string recommendedItemListOutputFeatureName = 20;
  if (!this->_internal_recommendeditemlistoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_recommendeditemlistoutputfeaturename());
  }

  // string recommendedItemScoreOutputFeatureName = 21;
  if (!this->_internal_recommendeditemscoreoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_recommendeditemscoreoutputfeaturename());
  }

  // .CoreML.Specification.StringVector itemStringIds = 2;
  if (this->_internal_has_itemstringids()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *itemstringids_);
  }

  // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
  if (this->_internal_has_itemint64ids()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *itemint64ids_);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}